

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::min(quadratic_cost_type<float> *this,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (n == 0) {
    auVar6 = ZEXT464(0x7f7fffff);
  }
  else {
    auVar6 = ZEXT464(0x7f7fffff);
    uVar4 = 0;
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    do {
      auVar9 = ZEXT416((uint)(this->linear_elements)._M_t.
                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar4]);
      auVar8 = vandps_avx(auVar9,auVar7);
      uVar1 = vcmpps_avx512vl(auVar8,auVar6._0_16_,1);
      uVar2 = vcmpps_avx512vl(auVar9,ZEXT816(0) << 0x40,4);
      bVar3 = (byte)uVar2 & (byte)uVar1;
      auVar6 = ZEXT1664(CONCAT124(auVar6._4_12_,
                                  (uint)(bVar3 & 1) * auVar8._0_4_ +
                                  (uint)!(bool)(bVar3 & 1) * auVar6._0_4_));
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  uVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar4 != 0) {
    uVar5 = 0;
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    do {
      auVar9 = ZEXT416((uint)(this->quadratic_elements)._M_t.
                             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                             .
                             super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                             ._M_head_impl[uVar5].factor);
      auVar7 = vandps_avx(auVar9,auVar8);
      uVar1 = vcmpps_avx512vl(auVar7,auVar6._0_16_,1);
      uVar2 = vcmpps_avx512vl(auVar9,ZEXT816(0) << 0x40,4);
      bVar3 = (byte)uVar2 & (byte)uVar1;
      auVar6 = ZEXT1664(CONCAT124(auVar6._4_12_,
                                  (uint)(bVar3 & 1) * auVar7._0_4_ +
                                  (uint)!(bool)(bVar3 & 1) * auVar6._0_4_));
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return auVar6._0_4_;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }